

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O2

WebPMuxError WebPMuxSetCanvasSize(WebPMux *mux,int width,int height)

{
  WebPMuxError WVar1;
  
  WVar1 = WEBP_MUX_INVALID_ARGUMENT;
  if ((((mux != (WebPMux *)0x0) && (height < 0x1000001)) && (width < 0x1000001)) &&
     (((-1 < (height | width) && ((int)((ulong)(uint)width * (ulong)(uint)height >> 0x20) == 0)) &&
      ((height * width != 0 || (height | width) == 0 &&
       (WVar1 = MuxDeleteAllNamedData(mux,0x58385056), (uint)WVar1 < 2)))))) {
    mux->canvas_width_ = width;
    mux->canvas_height_ = height;
    WVar1 = WEBP_MUX_OK;
  }
  return WVar1;
}

Assistant:

WebPMuxError WebPMuxSetCanvasSize(WebPMux* mux,
                                  int width, int height) {
  WebPMuxError err;
  if (mux == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  if (width < 0 || height < 0 ||
      width > MAX_CANVAS_SIZE || height > MAX_CANVAS_SIZE) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  if (width * (uint64_t)height >= MAX_IMAGE_AREA) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  if ((width * height) == 0 && (width | height) != 0) {
    // one of width / height is zero, but not both -> invalid!
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  // If we already assembled a VP8X chunk, invalidate it.
  err = MuxDeleteAllNamedData(mux, kChunks[IDX_VP8X].tag);
  if (err != WEBP_MUX_OK && err != WEBP_MUX_NOT_FOUND) return err;

  mux->canvas_width_ = width;
  mux->canvas_height_ = height;
  return WEBP_MUX_OK;
}